

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O1

void __thiscall CMU462::DynamicScene::Mesh::draw_faces(Mesh *this,bool smooth)

{
  Face *this_00;
  Scene *pSVar1;
  DrawStyle *pDVar2;
  DrawStyle **ppDVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  GLfloat faceColor [4];
  Vector3D N;
  GLfloat white [4];
  Vector3D normal;
  undefined8 local_a8;
  undefined8 uStack_a0;
  DrawStyle **local_90;
  DrawStyle **local_88;
  DrawStyle **local_80;
  _List_node_base *local_78;
  Vector3D local_70;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  Vector3D local_48;
  
  local_58 = 0x3f800000;
  uStack_54 = 0x3f800000;
  uStack_50 = 0x3f800000;
  uStack_4c = 0x3f800000;
  local_a8 = 0x3f8000003f800000;
  uStack_a0 = 0x3f8000003f800000;
  if ((this->super_SceneObject).isGhosted == true) {
    uStack_a0 = 0x3e8000003e800000;
    local_a8 = 0x3e8000003e800000;
  }
  glEnable(0xb50);
  glEnable(0x4000);
  glLightfv(0x4000,0x1201,&local_58);
  if (!smooth) {
    glMaterialfv(0x408,0x1201,&local_a8);
  }
  local_78 = (_List_node_base *)&(this->mesh).faces;
  p_Var5 = (this->mesh).faces.super__List_base<CMU462::Face,_std::allocator<CMU462::Face>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  if (p_Var5 != local_78) {
    local_90 = &this->hoveredStyle;
    local_80 = &this->selectedStyle;
    local_88 = &this->defaultStyle;
    do {
      glEnable(0x8037);
      glPolygonOffset(0x3f800000,0x3f800000);
      this_00 = (Face *)(p_Var5 + 1);
      pSVar1 = (this->super_SceneObject).scene;
      if ((pSVar1 == (Scene *)0x0) ||
         ((ppDVar3 = local_80, (Face *)(pSVar1->selected).element != this_00 &&
          (ppDVar3 = local_90, (Face *)(pSVar1->hovered).element != this_00)))) {
        ppDVar3 = local_88;
      }
      pDVar2 = *ppDVar3;
      if ((!smooth) && (pDVar2 != this->defaultStyle)) {
        glDisable(0xb50);
        glColor4fv(&pDVar2->faceColor);
      }
      glBegin(9);
      Face::normal(&local_48,this_00);
      if (!smooth) {
        glNormal3dv(&local_48);
      }
      p_Var4 = p_Var5[0xb]._M_prev;
      do {
        if (smooth) {
          Vertex::normal(&local_70,(Vertex *)(p_Var4[2]._M_prev + 1));
          glNormal3d(SUB84(local_70.x,0),local_70.y,local_70.z);
        }
        glVertex3dv(&p_Var4[2]._M_prev[1]._M_prev);
        p_Var4 = p_Var4[2]._M_next;
      } while (p_Var4 != p_Var5[0xb]._M_prev);
      glEnd();
      if (pDVar2 != this->defaultStyle) {
        glEnable(0xb50);
      }
      p_Var5 = p_Var5->_M_next;
    } while (p_Var5 != local_78);
  }
  return;
}

Assistant:

void Mesh::draw_faces(bool smooth) const {

   GLfloat white[4] = { 1., 1., 1., 1. };
   GLfloat faceColor[4] = { 1., 1., 1., 1. };
   if (isGhosted)
   {
     faceColor[0] = faceColor[1] = faceColor[2] = faceColor[3] = 0.25;
   }
   glEnable( GL_LIGHTING );
   glEnable( GL_LIGHT0 );
   glLightfv( GL_LIGHT0, GL_DIFFUSE, white );
   if (!smooth) glMaterialfv( GL_FRONT_AND_BACK, GL_DIFFUSE, faceColor);

  for (FaceCIter f = mesh.facesBegin(); f != mesh.facesEnd(); f++) {

    // Prevent z fighting (faces bleeding into edges and points).
    glEnable(GL_POLYGON_OFFSET_FILL);
    glPolygonOffset(1.0, 1.0);

    DrawStyle* style = get_draw_style(elementAddress(f));
    if (!smooth) {
      if (style != defaultStyle) {
        glDisable(GL_LIGHTING);
        style->style_face();
      }
    }

    glBegin(GL_POLYGON);
    Vector3D normal(f->normal());
    if (!smooth) glNormal3dv(&normal.x);
    HalfedgeCIter h = f->halfedge();
    do {
      if (smooth) {
        Vector3D N = h->vertex()->normal();
        glNormal3d(N.x, N.y, N.z);
      }
      glVertex3dv(&h->vertex()->position.x);
      h = h->next();
    } while (h != f->halfedge());
    glEnd();

    if (style != defaultStyle) {
      glEnable(GL_LIGHTING);
    }
  }
}